

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

TestObject<128UL,_8UL> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
::reentrant_consume_operation::element<density_tests::TestObject<128ul,8ul>>
          (reentrant_consume_operation *this)

{
  runtime_type<> *prVar1;
  TestObject<128UL,_8UL> *pTVar2;
  
  if (0xf < *(ulong *)(this + 0x10)) {
    prVar1 = lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)this);
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
        ::s_table) goto LAB_010a7dbd;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
             ,0xa3f);
LAB_010a7dbd:
  pTVar2 = (TestObject<128UL,_8UL> *)
           detail::
           LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
           ::get_element(*(LfQueueControl **)(this + 8),SUB41((*(uint *)(this + 0x10) & 4) >> 2,0));
  return pTVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }